

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O1

void __thiscall
Dinic_BenchmarkChainV1000E10000_Test::TestBody(Dinic_BenchmarkChainV1000E10000_Test *this)

{
  bool bVar1;
  int iVar2;
  char *message;
  int iVar3;
  int a;
  int b;
  undefined1 local_c8 [8];
  Dinic d;
  ll flow;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  srand(1);
  Dinic::Dinic((Dinic *)local_c8,1000);
  a = 0;
  do {
    b = a + 1;
    iVar3 = 10;
    do {
      iVar2 = rand();
      Dinic::addEdge((Dinic *)local_c8,a,b,(ulong)(iVar2 % 1000 + 1000));
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    a = b;
  } while (b != 999);
  d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Dinic::getFlow((Dinic *)local_c8,0,999);
  local_38.ptr_._0_4_ = 0x3057;
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&flow,"12375","flow",(int *)&local_38,
             (longlong *)
             &d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  if ((char)flow == '\0') {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/dinic_test.cpp"
               ,0x87,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (d.d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(d.d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (d.g.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(d.g.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&d.e.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  if (d._8_8_ != 0) {
    operator_delete((void *)d._8_8_);
  }
  return;
}

Assistant:

TEST(Dinic, BenchmarkChainV1000E10000) {
    srand(1);
    int n = 1000;
    int m = 10000;
    int range = 1000;
    int perEdge = m / n; // yes, it's not exact
    Dinic d(n);
    rep(i, 0, n - 1) {
        rep(j, 0, perEdge) {
            d.addEdge(i, i + 1, range + rand() % range);
        }
    }
    ll flow = d.getFlow(0, n - 1);
    EXPECT_EQ(12375, flow);
}